

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.h
# Opt level: O3

string * __thiscall dd::Location::ToString_abi_cxx11_(string *__return_storage_ptr__,Location *this)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  string file_name;
  char buf [256];
  long *local_158;
  int local_150;
  long local_148 [2];
  long *local_138 [2];
  long local_128 [31];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,this->_file_name,(allocator<char> *)local_138);
  iVar3 = local_150 + 1;
  do {
    if (iVar3 + -2 < 0) goto LAB_0011bdbb;
    std::__cxx11::string::substr((ulong)local_138,(ulong)&local_158);
    iVar1 = std::__cxx11::string::compare((char *)local_138);
    if (local_138[0] != local_128) {
      operator_delete(local_138[0],local_128[0] + 1);
    }
    iVar3 = iVar3 + -1;
  } while (iVar1 != 0);
  std::__cxx11::string::substr((ulong)local_138,(ulong)&local_158);
  std::__cxx11::string::operator=((string *)&local_158,(string *)local_138);
  if (local_138[0] != local_128) {
    operator_delete(local_138[0],local_128[0] + 1);
  }
LAB_0011bdbb:
  memset(local_138,0,0x100);
  snprintf((char *)local_138,0x100,"%s@%s:%d",this->_function_name,local_158,
           (ulong)(uint)this->_line_number);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen((char *)local_138);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_138,(long)local_138 + sVar2);
  if (local_158 != local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString()const {
			std::string file_name = _file_name;
			for (int i = file_name.length() - 1; i >= 0; i--)
			{
#ifdef WIN32
				if (file_name.substr(i, 1) == "\\")
#else
				if (file_name.substr(i, 1) == "/")
#endif
				{
					file_name = file_name.substr(i + 1);
					break;
				}
			}

			char buf[256] = { 0 };
			snprintf(buf, sizeof(buf), "%s@%s:%d", _function_name, file_name.c_str(), _line_number);
			return buf;
		}